

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::deleteCurrent(QFileDialogPrivate *this)

{
  QWidget *parent;
  QModelIndex *pQVar1;
  QModelIndex *pQVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  StandardButton SVar6;
  long lVar7;
  int iVar8;
  QWidget *parent_00;
  long in_FS_OFFSET;
  QModelIndex local_e8;
  QModelIndex local_d0;
  QArrayDataPointer<char16_t> local_b8;
  Data *local_98;
  char16_t *pcStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QPersistentModelIndex index;
  QArrayDataPointer<QModelIndex> local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QFileSystemModel::isReadOnly();
  if (cVar3 == '\0') {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
    QItemSelectionModel::selectedRows((int)&local_78);
    pQVar2 = local_78.ptr;
    for (lVar7 = local_78.size * 0x18; lVar7 != 0; lVar7 = lVar7 + -0x18) {
      index.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::QPersistentModelIndex
                (&index,(QModelIndex *)((long)&pQVar2[-1].r + lVar7));
      QAbstractItemView::rootIndex
                (&local_58,(QAbstractItemView *)((this->qFileDialogUi).d)->listView);
      cVar3 = ::comparesEqual(&index,&local_58);
      if (cVar3 == '\0') {
        QPersistentModelIndex::row();
        QPersistentModelIndex::sibling((int)(QModelIndex *)&local_98,(int)&index);
        mapToSource(&local_58,this,(QModelIndex *)&local_98);
        QPersistentModelIndex::operator=(&index,&local_58);
        cVar3 = QPersistentModelIndex::isValid();
        if (cVar3 == '\0') goto LAB_004a0783;
        local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_90 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        iVar8 = (int)&local_58;
        QPersistentModelIndex::data(iVar8);
        ::QVariant::toString();
        ::QVariant::~QVariant((QVariant *)&local_58);
        local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::data(iVar8);
        ::QVariant::toString();
        ::QVariant::~QVariant((QVariant *)&local_58);
        QPersistentModelIndex::parent();
        QModelIndex::data((QVariant *)&local_58,&local_d0,0x103);
        uVar5 = ::QVariant::toInt((bool *)&local_58);
        ::QVariant::~QVariant((QVariant *)&local_58);
        parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
        parent_00 = parent;
        if ((uVar5 >> 9 & 1) == 0) {
          QFileDialog::tr((QString *)&local_58,"Delete",(char *)0x0,-1);
          QFileDialog::tr((QString *)&local_e8,
                          "\'%1\' is write protected.\nDo you want to delete it anyway?",(char *)0x0
                          ,-1);
          QString::arg<QString,_true>
                    ((QString *)&local_d0,(QString *)&local_e8,(QString *)&local_98,0,(QChar)0x20);
          SVar6 = QMessageBox::warning
                            (parent,(QString *)&local_58,(QString *)&local_d0,
                             (StandardButtons)0x14000,No);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
          if (SVar6 != No) {
            parent_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
            goto LAB_004a060a;
          }
LAB_004a07de:
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
          QPersistentModelIndex::~QPersistentModelIndex(&index);
          break;
        }
LAB_004a060a:
        QFileDialog::tr((QString *)&local_58,"Delete",(char *)0x0,-1);
        QFileDialog::tr((QString *)&local_e8,"Are you sure you want to delete \'%1\'?",(char *)0x0,
                        -1);
        QString::arg<QString,_true>
                  ((QString *)&local_d0,(QString *)&local_e8,(QString *)&local_98,0,(QChar)0x20);
        SVar6 = QMessageBox::warning
                          (parent_00,(QString *)&local_58,(QString *)&local_d0,
                           (StandardButtons)0x14000,No);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        if ((SVar6 == No) || (cVar3 = QPersistentModelIndex::isValid(), cVar3 == '\0'))
        goto LAB_004a07de;
        pQVar1 = (QModelIndex *)this->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&index);
        cVar3 = QFileSystemModel::isDir(pQVar1);
        if (cVar3 == '\0') {
LAB_004a0792:
          pQVar1 = (QModelIndex *)this->model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&index);
          QFileSystemModel::remove(pQVar1);
        }
        else {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_d0,&index);
          QFileSystemModel::fileInfo(&local_e8);
          cVar3 = QFileInfo::isSymLink();
          QFileInfo::~QFileInfo((QFileInfo *)&local_e8);
          if (cVar3 != '\0') goto LAB_004a0792;
          bVar4 = removeDirectory(this,(QString *)&local_b8);
          if (!bVar4) {
            QWidget::windowTitle((QString *)&local_58,parent);
            QFileDialog::tr((QString *)&local_d0,"Could not delete directory.",(char *)0x0,-1);
            QMessageBox::warning
                      (parent,(QString *)&local_58,(QString *)&local_d0,(StandardButtons)0x400,
                       NoButton);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_d0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_58);
          }
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QPersistentModelIndex::~QPersistentModelIndex(&index);
      }
      else {
LAB_004a0783:
        QPersistentModelIndex::~QPersistentModelIndex(&index);
      }
    }
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::deleteCurrent()
{
    if (model->isReadOnly())
        return;

    const QModelIndexList list = qFileDialogUi->listView->selectionModel()->selectedRows();
    for (auto it = list.crbegin(), end = list.crend(); it != end; ++it) {
        QPersistentModelIndex index = *it;
        if (index == qFileDialogUi->listView->rootIndex())
            continue;

        index = mapToSource(index.sibling(index.row(), 0));
        if (!index.isValid())
            continue;

        QString fileName = index.data(QFileSystemModel::FileNameRole).toString();
        QString filePath = index.data(QFileSystemModel::FilePathRole).toString();

        QFile::Permissions p(index.parent().data(QFileSystemModel::FilePermissions).toInt());
#if QT_CONFIG(messagebox)
        Q_Q(QFileDialog);
        if (!(p & QFile::WriteUser) && (QMessageBox::warning(q_func(), QFileDialog::tr("Delete"),
                                    QFileDialog::tr("'%1' is write protected.\nDo you want to delete it anyway?")
                                    .arg(fileName),
                                     QMessageBox::Yes | QMessageBox::No, QMessageBox::No) == QMessageBox::No))
            return;
        else if (QMessageBox::warning(q_func(), QFileDialog::tr("Delete"),
                                      QFileDialog::tr("Are you sure you want to delete '%1'?")
                                      .arg(fileName),
                                      QMessageBox::Yes | QMessageBox::No, QMessageBox::No) == QMessageBox::No)
            return;

        // the event loop has run, we have to validate if the index is valid because the model might have removed it.
        if (!index.isValid())
            return;

#else
        if (!(p & QFile::WriteUser))
            return;
#endif // QT_CONFIG(messagebox)

        if (model->isDir(index) && !model->fileInfo(index).isSymLink()) {
            if (!removeDirectory(filePath)) {
#if QT_CONFIG(messagebox)
            QMessageBox::warning(q, q->windowTitle(),
                                QFileDialog::tr("Could not delete directory."));
#endif
            }
        } else {
            model->remove(index);
        }
    }
}